

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Config::Config(Config *this,ConfigData *data)

{
  long lVar1;
  bool bVar2;
  string *prefix;
  streambuf *s;
  TestCaseFilters *pTVar3;
  const_reference pvVar4;
  size_type sVar5;
  long in_RSI;
  string *in_RDI;
  TestCaseFilter *unaff_retaddr;
  string filter;
  size_t i_1;
  TestCaseFilters filters;
  size_t i;
  string groupName;
  undefined6 in_stack_fffffffffffffe58;
  byte bVar6;
  undefined1 in_stack_fffffffffffffe5f;
  TestCaseFilters *in_stack_fffffffffffffe60;
  undefined6 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6e;
  undefined1 in_stack_fffffffffffffe6f;
  allocator *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffe78;
  ulong uVar7;
  TestCaseFilters *this_00;
  ConfigData *in_stack_fffffffffffffe88;
  ConfigData *in_stack_fffffffffffffe90;
  undefined5 in_stack_fffffffffffffed8;
  byte bVar8;
  byte bVar9;
  allocator<char> in_stack_fffffffffffffedf;
  TestCaseFilters *in_stack_fffffffffffffee0;
  allocator local_f9;
  string local_f8 [32];
  string local_d8 [32];
  ulong local_b8;
  TestCaseFilters *local_48;
  string local_40 [52];
  string *testSpec;
  
  unique0x10000486 = in_RSI;
  testSpec = in_RDI;
  SharedImpl<Catch::IConfig>::SharedImpl((SharedImpl<Catch::IConfig> *)in_stack_fffffffffffffe60);
  *(undefined ***)in_RDI = &PTR__Config_0021f2b0;
  ConfigData::ConfigData(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  Stream::Stream((Stream *)(in_RDI + 0xc0));
  prefix = in_RDI + 0xd0;
  s = (streambuf *)std::ios::rdbuf();
  std::ostream::ostream(prefix,s);
  std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::vector
            ((vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *)0x1c05bb);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffe70);
  if (!bVar2) {
    std::__cxx11::string::string(local_40);
    local_48 = (TestCaseFilters *)0x0;
    while (this_00 = local_48,
          pTVar3 = (TestCaseFilters *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(stack0xfffffffffffffff0 + 0x98)), this_00 < pTVar3) {
      if (local_48 != (TestCaseFilters *)0x0) {
        std::__cxx11::string::operator+=(local_40," ");
      }
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(stack0xfffffffffffffff0 + 0x98),(size_type)local_48);
      std::__cxx11::string::operator+=(local_40,(string *)pvVar4);
      local_48 = (TestCaseFilters *)
                 ((long)&(local_48->m_tagExpressions).
                         super__Vector_base<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1);
    }
    TestCaseFilters::TestCaseFilters(this_00,in_stack_fffffffffffffe78);
    local_b8 = 0;
    while (uVar7 = local_b8,
          sVar5 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(stack0xfffffffffffffff0 + 0x98)), uVar7 < sVar5) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(stack0xfffffffffffffff0 + 0x98),local_b8);
      std::__cxx11::string::string(local_d8,(string *)pvVar4);
      in_stack_fffffffffffffe70 = &local_f9;
      std::allocator<char>::allocator();
      bVar9 = 0;
      bVar8 = 0;
      std::__cxx11::string::string(local_f8,"[",in_stack_fffffffffffffe70);
      in_stack_fffffffffffffe6f = startsWith((string *)s,prefix);
      bVar6 = true;
      if (!(bool)in_stack_fffffffffffffe6f) {
        in_stack_fffffffffffffe60 = (TestCaseFilters *)&stack0xfffffffffffffedf;
        std::allocator<char>::allocator();
        bVar9 = 1;
        std::__cxx11::string::string
                  ((string *)&stack0xfffffffffffffee0,"~[",(allocator *)in_stack_fffffffffffffe60);
        bVar8 = 1;
        in_stack_fffffffffffffe5f = startsWith((string *)s,prefix);
        bVar6 = in_stack_fffffffffffffe5f;
      }
      in_stack_fffffffffffffe6e = bVar6;
      if ((bVar8 & 1) != 0) {
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
      }
      if ((bVar9 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffedf);
      }
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      lVar1 = stack0xfffffffffffffff0;
      if ((bVar6 & 1) == 0) {
        uVar7 = (ulong)stack0xfffffffffffffff0 >> 0x20;
        TestCaseFilter::TestCaseFilter(unaff_retaddr,testSpec,(DoWhat)uVar7);
        stack0xfffffffffffffff0 = lVar1;
        TestCaseFilters::addFilter
                  (in_stack_fffffffffffffe60,
                   (TestCaseFilter *)
                   CONCAT17(in_stack_fffffffffffffe5f,CONCAT16(bVar6,in_stack_fffffffffffffe58)));
        TestCaseFilter::~TestCaseFilter((TestCaseFilter *)0x1c09b5);
      }
      else {
        TestCaseFilters::addTags
                  (in_stack_fffffffffffffee0,
                   (string *)
                   CONCAT17(in_stack_fffffffffffffedf,
                            CONCAT16(bVar9,CONCAT15(bVar8,in_stack_fffffffffffffed8))));
      }
      std::__cxx11::string::~string(local_d8);
      local_b8 = local_b8 + 1;
    }
    std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::push_back
              ((vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *)
               in_stack_fffffffffffffe70,
               (value_type *)
               CONCAT17(in_stack_fffffffffffffe6f,
                        CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)));
    TestCaseFilters::~TestCaseFilters(in_stack_fffffffffffffe60);
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

Config( ConfigData const& data )
        :   m_data( data ),
            m_os( std::cout.rdbuf() )
        {
            if( !data.testsOrTags.empty() ) {
                std::string groupName;
                for( std::size_t i = 0; i < data.testsOrTags.size(); ++i ) {
                    if( i != 0 )
                        groupName += " ";
                    groupName += data.testsOrTags[i];
                }
                TestCaseFilters filters( groupName );
                for( std::size_t i = 0; i < data.testsOrTags.size(); ++i ) {
                    std::string filter = data.testsOrTags[i];
                    if( startsWith( filter, "[" ) || startsWith( filter, "~[" ) )
                        filters.addTags( filter );
                    else
                        filters.addFilter( TestCaseFilter( filter ) );
                }
                m_filterSets.push_back( filters );
            }
        }